

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitBrOn(BinaryInstWriter *this,BrOn *curr)

{
  BrOnOp BVar1;
  Type right;
  ulong uVar2;
  WasmBinaryWriter *pWVar3;
  bool bVar4;
  Exactness EVar5;
  U32LEB UVar6;
  HeapType HVar7;
  byte x;
  ulong uVar8;
  BufferWithRandomAccess *pBVar9;
  Name name;
  Name name_00;
  size_t sStack_40;
  
  BVar1 = curr->op;
  if (1 < BVar1 - BrOnCast) {
    if (BVar1 == BrOnNonNull) {
      pBVar9 = this->o;
      sStack_40 = 0xffffffffffffffd6;
    }
    else {
      if (BVar1 != BrOnNull) {
        handle_unreachable("invalid br_on_*",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0x90a);
      }
      pBVar9 = this->o;
      sStack_40 = 0xffffffffffffffd5;
    }
    BufferWithRandomAccess::operator<<(pBVar9,(int8_t)sStack_40);
    pBVar9 = this->o;
    name_00.super_IString.str._M_str = (curr->name).super_IString.str._M_str;
    name_00.super_IString.str._M_len = sStack_40;
    UVar6.value = getBreakIndex(this,name_00);
    BufferWithRandomAccess::operator<<(pBVar9,UVar6);
    return;
  }
  BufferWithRandomAccess::operator<<(this->o,-5);
  BufferWithRandomAccess::operator<<(this->o,(U32LEB)(curr->op == BrOnCast ^ 0x19));
  right.id = (curr->ref->type).id;
  if ((6 < right.id) && ((right.id & 1) == 0)) {
    bVar4 = wasm::Type::isSubType((Type)(curr->castType).id,right);
    if (bVar4) {
      uVar8 = (curr->castType).id;
      uVar2 = (curr->ref->type).id;
      x = (((uint)uVar8 & 3) == 2 && 6 < uVar8) * '\x02' | (((uint)uVar2 & 3) == 2 && 6 < uVar2);
      uVar8 = (ulong)x;
      BufferWithRandomAccess::operator<<(this->o,x);
      pBVar9 = this->o;
      name.super_IString.str._M_str = (curr->name).super_IString.str._M_str;
      name.super_IString.str._M_len = uVar8;
      UVar6.value = getBreakIndex(this,name);
      BufferWithRandomAccess::operator<<(pBVar9,UVar6);
      pWVar3 = this->parent;
      HVar7 = wasm::Type::getHeapType(&curr->ref->type);
      EVar5 = wasm::Type::getExactness(&curr->ref->type);
      WasmBinaryWriter::writeHeapType(pWVar3,HVar7,EVar5);
      pWVar3 = this->parent;
      HVar7 = wasm::Type::getHeapType(&curr->castType);
      EVar5 = wasm::Type::getExactness(&curr->castType);
      WasmBinaryWriter::writeHeapType(pWVar3,HVar7,EVar5);
      return;
    }
    __assert_fail("Type::isSubType(curr->castType, curr->ref->type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                  ,0x8fe,"void wasm::BinaryInstWriter::visitBrOn(BrOn *)");
  }
  __assert_fail("curr->ref->type.isRef()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                ,0x8fd,"void wasm::BinaryInstWriter::visitBrOn(BrOn *)");
}

Assistant:

void BinaryInstWriter::visitBrOn(BrOn* curr) {
  switch (curr->op) {
    case BrOnNull:
      o << int8_t(BinaryConsts::BrOnNull);
      o << U32LEB(getBreakIndex(curr->name));
      return;
    case BrOnNonNull:
      o << int8_t(BinaryConsts::BrOnNonNull);
      o << U32LEB(getBreakIndex(curr->name));
      return;
    case BrOnCast:
    case BrOnCastFail: {
      o << int8_t(BinaryConsts::GCPrefix);
      if (curr->op == BrOnCast) {
        o << U32LEB(BinaryConsts::BrOnCast);
      } else {
        o << U32LEB(BinaryConsts::BrOnCastFail);
      }
      assert(curr->ref->type.isRef());
      assert(Type::isSubType(curr->castType, curr->ref->type));
      uint8_t flags = (curr->ref->type.isNullable() ? 1 : 0) |
                      (curr->castType.isNullable() ? 2 : 0);
      o << flags;
      o << U32LEB(getBreakIndex(curr->name));
      parent.writeHeapType(curr->ref->type.getHeapType(),
                           curr->ref->type.getExactness());
      parent.writeHeapType(curr->castType.getHeapType(),
                           curr->castType.getExactness());
      return;
    }
  }
  WASM_UNREACHABLE("invalid br_on_*");
}